

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O3

int run_test_tcp_open_bound(void)

{
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uint uVar3;
  undefined8 uVar4;
  ulong uVar5;
  uv_timer_t *puVar6;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  code *__addr;
  uv_shutdown_t *puVar7;
  uv_write_t *puVar8;
  uv_connect_t *puVar9;
  uv_tcp_t *puVar10;
  uv_stream_t *puVar11;
  sockaddr_in addr;
  uv_tcp_t server;
  undefined1 auStack_290 [16];
  code *pcStack_280;
  undefined1 auStack_278 [16];
  code *pcStack_268;
  code *pcStack_260;
  code *pcStack_258;
  code *pcStack_250;
  code *pcStack_248;
  undefined1 auStack_238 [16];
  sockaddr sStack_228;
  uv_write_t uStack_218;
  code *pcStack_120;
  sockaddr local_110;
  undefined1 local_100 [248];
  
  pcStack_120 = (code *)0x173359;
  uVar1 = create_tcp_socket();
  uVar5 = (ulong)uVar1;
  pcStack_120 = (code *)0x173371;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&local_110);
  if (iVar2 == 0) {
    pcStack_120 = (code *)0x17337e;
    uVar4 = uv_default_loop();
    pcStack_120 = (code *)0x17338b;
    iVar2 = uv_tcp_init(uVar4,local_100);
    if (iVar2 != 0) goto LAB_0017340d;
    pcStack_120 = (code *)0x1733a0;
    iVar2 = bind(uVar1,&local_110,0x10);
    if (iVar2 != 0) goto LAB_00173412;
    pcStack_120 = (code *)0x1733b0;
    iVar2 = uv_tcp_open(local_100,uVar1);
    if (iVar2 != 0) goto LAB_00173417;
    pcStack_120 = (code *)0x1733c5;
    iVar2 = uv_listen(local_100,0x80,0);
    if (iVar2 != 0) goto LAB_0017341c;
    pcStack_120 = (code *)0x1733ce;
    uVar5 = uv_default_loop();
    pcStack_120 = (code *)0x1733e2;
    uv_walk(uVar5,close_walk_cb,0);
    pcStack_120 = (code *)0x1733ec;
    uv_run(uVar5,0);
    pcStack_120 = (code *)0x1733f1;
    uVar4 = uv_default_loop();
    pcStack_120 = (code *)0x1733f9;
    iVar2 = uv_loop_close(uVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_120 = (code *)0x17340d;
    run_test_tcp_open_bound_cold_1();
LAB_0017340d:
    pcStack_120 = (code *)0x173412;
    run_test_tcp_open_bound_cold_2();
LAB_00173412:
    pcStack_120 = (code *)0x173417;
    run_test_tcp_open_bound_cold_3();
LAB_00173417:
    pcStack_120 = (code *)0x17341c;
    run_test_tcp_open_bound_cold_4();
LAB_0017341c:
    pcStack_120 = (code *)0x173421;
    run_test_tcp_open_bound_cold_5();
  }
  pcStack_120 = run_test_tcp_open_connected;
  run_test_tcp_open_bound_cold_6();
  pcStack_248 = (code *)0x17343f;
  pcStack_120 = (code *)uVar5;
  auStack_238 = uv_buf_init("PING",4);
  puVar7 = (uv_shutdown_t *)0x194b4a;
  __addr = (code *)0x23a3;
  pcStack_248 = (code *)0x17345f;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_228);
  if (iVar2 == 0) {
    pcStack_248 = (code *)0x17346c;
    uVar1 = create_tcp_socket();
    uVar5 = (ulong)uVar1;
    __addr = (code *)&sStack_228;
    puVar7 = (uv_shutdown_t *)(ulong)uVar1;
    pcStack_248 = (code *)0x17347f;
    iVar2 = connect(uVar1,(sockaddr *)__addr,0x10);
    if (iVar2 != 0) goto LAB_0017358d;
    pcStack_248 = (code *)0x17348c;
    puVar7 = (uv_shutdown_t *)uv_default_loop();
    __addr = (code *)(&sStack_228 + 1);
    pcStack_248 = (code *)0x173499;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_00173592;
    puVar7 = (uv_shutdown_t *)(&sStack_228 + 1);
    __addr = (code *)(ulong)uVar1;
    pcStack_248 = (code *)0x1734ad;
    iVar2 = uv_tcp_open();
    if (iVar2 != 0) goto LAB_00173597;
    puVar8 = &write_req;
    __addr = (code *)(&sStack_228 + 1);
    pcStack_248 = (code *)0x1734d7;
    iVar2 = uv_write(&write_req,__addr,auStack_238,1,write_cb);
    puVar7 = (uv_shutdown_t *)puVar8;
    if (iVar2 != 0) goto LAB_0017359c;
    puVar7 = &shutdown_req;
    __addr = (code *)(&sStack_228 + 1);
    pcStack_248 = (code *)0x1734f7;
    iVar2 = uv_shutdown(&shutdown_req,__addr,shutdown_cb);
    if (iVar2 != 0) goto LAB_001735a1;
    __addr = alloc_cb;
    puVar7 = (uv_shutdown_t *)(&sStack_228 + 1);
    pcStack_248 = (code *)0x173517;
    iVar2 = uv_read_start(puVar7,alloc_cb,read_cb);
    if (iVar2 != 0) goto LAB_001735a6;
    pcStack_248 = (code *)0x173524;
    puVar7 = (uv_shutdown_t *)uv_default_loop();
    __addr = (code *)0x0;
    pcStack_248 = (code *)0x17352e;
    uv_run();
    if (shutdown_cb_called != 1) goto LAB_001735ab;
    if (write_cb_called != 1) goto LAB_001735b0;
    if (close_cb_called != 1) goto LAB_001735b5;
    pcStack_248 = (code *)0x17354e;
    uVar5 = uv_default_loop();
    pcStack_248 = (code *)0x173562;
    uv_walk(uVar5,close_walk_cb,0);
    __addr = (code *)0x0;
    pcStack_248 = (code *)0x17356c;
    uv_run(uVar5);
    pcStack_248 = (code *)0x173571;
    puVar7 = (uv_shutdown_t *)uv_default_loop();
    pcStack_248 = (code *)0x173579;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_248 = (code *)0x17358d;
    run_test_tcp_open_connected_cold_1();
LAB_0017358d:
    pcStack_248 = (code *)0x173592;
    run_test_tcp_open_connected_cold_2();
LAB_00173592:
    pcStack_248 = (code *)0x173597;
    run_test_tcp_open_connected_cold_3();
LAB_00173597:
    pcStack_248 = (code *)0x17359c;
    run_test_tcp_open_connected_cold_4();
LAB_0017359c:
    pcStack_248 = (code *)0x1735a1;
    run_test_tcp_open_connected_cold_5();
LAB_001735a1:
    pcStack_248 = (code *)0x1735a6;
    run_test_tcp_open_connected_cold_6();
LAB_001735a6:
    pcStack_248 = (code *)0x1735ab;
    run_test_tcp_open_connected_cold_7();
LAB_001735ab:
    pcStack_248 = (code *)0x1735b0;
    run_test_tcp_open_connected_cold_8();
LAB_001735b0:
    pcStack_248 = (code *)0x1735b5;
    run_test_tcp_open_connected_cold_9();
LAB_001735b5:
    pcStack_248 = (code *)0x1735ba;
    run_test_tcp_open_connected_cold_10();
  }
  pcStack_248 = write_cb;
  run_test_tcp_open_connected_cold_11();
  if ((uv_write_t *)puVar7 == (uv_write_t *)0x0) {
    pcStack_250 = (code *)0x1735d6;
    write_cb_cold_2();
  }
  else if ((int)__addr == 0) {
    write_cb_called = write_cb_called + 1;
    return extraout_EAX;
  }
  puVar7 = (uv_shutdown_t *)((ulong)__addr & 0xffffffff);
  pcStack_250 = shutdown_cb;
  write_cb_cold_1();
  if (puVar7 == &shutdown_req) {
    if ((int)__addr == 0) {
      shutdown_cb_called = shutdown_cb_called + 1;
      return extraout_EAX_00;
    }
  }
  else {
    pcStack_258 = (code *)0x1735fb;
    shutdown_cb_cold_1();
  }
  pcStack_258 = alloc_cb;
  shutdown_cb_cold_2();
  if (__addr < (sockaddr *)0x10001) {
    *extraout_RDX = alloc_cb::slab;
    extraout_RDX[1] = 0x10000;
    return 0x31ec70;
  }
  pcStack_260 = read_cb;
  alloc_cb_cold_1();
  if (puVar7 == (uv_shutdown_t *)0x0) {
    pcStack_268 = (code *)0x17365b;
    read_cb_cold_4();
LAB_0017365b:
    pcStack_268 = (code *)0x173660;
    read_cb_cold_2();
LAB_00173660:
    pcStack_268 = (code *)0x173665;
    read_cb_cold_3();
  }
  else {
    if (-1 < (long)__addr) {
      if ((sockaddr *)__addr != (sockaddr *)0x4) goto LAB_0017365b;
      if (*(int *)*extraout_RDX_00 == 0x474e4950) {
        return extraout_EAX_01;
      }
      goto LAB_00173660;
    }
    if ((sockaddr *)__addr == (sockaddr *)0xfffffffffffff001) {
      iVar2 = uv_close();
      return iVar2;
    }
  }
  pcStack_268 = run_test_tcp_write_ready;
  read_cb_cold_1();
  puVar9 = (uv_connect_t *)0x194b4a;
  uVar1 = 0x23a3;
  pcStack_280 = (code *)0x173683;
  pcStack_268 = (code *)uVar5;
  iVar2 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_278);
  if (iVar2 == 0) {
    pcStack_280 = (code *)0x173690;
    uVar3 = create_tcp_socket();
    uVar5 = (ulong)uVar3;
    pcStack_280 = (code *)0x173697;
    puVar9 = (uv_connect_t *)uv_default_loop();
    uVar1 = 0x31e9f0;
    pcStack_280 = (code *)0x1736a6;
    iVar2 = uv_tcp_init();
    if (iVar2 != 0) goto LAB_00173766;
    puVar10 = &client;
    pcStack_280 = (code *)0x1736bc;
    iVar2 = uv_tcp_open();
    puVar9 = (uv_connect_t *)puVar10;
    if (iVar2 != 0) goto LAB_0017376b;
    puVar9 = &connect_req;
    uVar3 = 0x31e9f0;
    pcStack_280 = (code *)0x1736e1;
    iVar2 = uv_tcp_connect(&connect_req,&client,auStack_278,connect1_cb);
    if (iVar2 != 0) goto LAB_00173770;
    pcStack_280 = (code *)0x1736ee;
    puVar9 = (uv_connect_t *)uv_default_loop();
    uVar3 = 0;
    pcStack_280 = (code *)0x1736f8;
    uv_run();
    if (shutdown_cb_called != 1) goto LAB_00173775;
    if (shutdown_requested != 1) goto LAB_0017377a;
    if (connect_cb_called != 1) goto LAB_0017377f;
    if (write_cb_called < 1) goto LAB_00173784;
    if (close_cb_called != 1) goto LAB_00173789;
    pcStack_280 = (code *)0x17372a;
    uVar5 = uv_default_loop();
    pcStack_280 = (code *)0x17373e;
    uv_walk(uVar5,close_walk_cb,0);
    uVar3 = 0;
    pcStack_280 = (code *)0x173748;
    uv_run(uVar5);
    pcStack_280 = (code *)0x17374d;
    puVar9 = (uv_connect_t *)uv_default_loop();
    pcStack_280 = (code *)0x173755;
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_280 = (code *)0x173766;
    run_test_tcp_write_ready_cold_1();
LAB_00173766:
    uVar3 = uVar1;
    pcStack_280 = (code *)0x17376b;
    run_test_tcp_write_ready_cold_2();
LAB_0017376b:
    pcStack_280 = (code *)0x173770;
    run_test_tcp_write_ready_cold_3();
LAB_00173770:
    pcStack_280 = (code *)0x173775;
    run_test_tcp_write_ready_cold_4();
LAB_00173775:
    pcStack_280 = (code *)0x17377a;
    run_test_tcp_write_ready_cold_5();
LAB_0017377a:
    pcStack_280 = (code *)0x17377f;
    run_test_tcp_write_ready_cold_6();
LAB_0017377f:
    pcStack_280 = (code *)0x173784;
    run_test_tcp_write_ready_cold_7();
LAB_00173784:
    pcStack_280 = (code *)0x173789;
    run_test_tcp_write_ready_cold_8();
LAB_00173789:
    pcStack_280 = (code *)0x17378e;
    run_test_tcp_write_ready_cold_9();
  }
  pcStack_280 = connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar11 = connect_req.handle;
  pcStack_280 = (code *)uVar5;
  if (puVar9 == &connect_req) {
    puVar6 = (uv_timer_t *)puVar9;
    if (uVar3 != 0) goto LAB_00173859;
    connect_cb_called = connect_cb_called + 1;
    puVar6 = (uv_timer_t *)uv_default_loop();
    iVar2 = uv_timer_init(puVar6,&tm);
    if (iVar2 != 0) goto LAB_0017385e;
    puVar6 = &tm;
    iVar2 = uv_timer_start(&tm,timer_cb,2000,0);
    if (iVar2 != 0) goto LAB_00173863;
    auStack_290 = uv_buf_init("P",1);
    puVar8 = &write_req;
    iVar2 = uv_write(&write_req,puVar11,auStack_290,1,write1_cb);
    puVar6 = (uv_timer_t *)puVar8;
    if (iVar2 == 0) {
      iVar2 = uv_read_start(puVar11,alloc_cb,read1_cb);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0017386d;
    }
  }
  else {
    connect1_cb_cold_1();
    puVar6 = (uv_timer_t *)puVar9;
LAB_00173859:
    connect1_cb_cold_2();
LAB_0017385e:
    connect1_cb_cold_3();
LAB_00173863:
    connect1_cb_cold_4();
  }
  puVar11 = (uv_stream_t *)puVar6;
  connect1_cb_cold_5();
LAB_0017386d:
  connect1_cb_cold_6();
  iVar2 = uv_is_closing();
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = uv_close(puVar11,0);
  return iVar2;
}

Assistant:

TEST_IMPL(tcp_open_bound) {
  struct sockaddr_in addr;
  uv_tcp_t server;
  uv_os_sock_t sock;

  startup();
  sock = create_tcp_socket();

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT(0 == uv_tcp_init(uv_default_loop(), &server));

  ASSERT(0 == bind(sock, (struct sockaddr*) &addr, sizeof(addr)));

  ASSERT(0 == uv_tcp_open(&server, sock));

  ASSERT(0 == uv_listen((uv_stream_t*) &server, 128, NULL));

  MAKE_VALGRIND_HAPPY();
  return 0;
}